

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlChar * xmlXPathCastBooleanToString(int val)

{
  xmlChar *pxVar1;
  char *cur;
  
  cur = "true";
  if (val == 0) {
    cur = "false";
  }
  pxVar1 = xmlStrdup((xmlChar *)cur);
  return pxVar1;
}

Assistant:

xmlChar *
xmlXPathCastBooleanToString (int val) {
    xmlChar *ret;
    if (val)
	ret = xmlStrdup((const xmlChar *) "true");
    else
	ret = xmlStrdup((const xmlChar *) "false");
    return(ret);
}